

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

void Amulet_off(void)

{
  uint uVar1;
  
  if (uamul == (obj *)0x0) {
    return;
  }
  Oprops_off(uamul,0x10000);
  takeoff_mask = takeoff_mask & 0xfffeffff;
  switch(uamul->otyp) {
  case 0xc9:
    setworn((obj *)0x0,0x10000);
    see_monsters();
    return;
  case 0xcb:
    if (u.uprops[0x22].intrinsic != 0) {
      pline("You can breathe more easily!");
      u.uprops[0x22].intrinsic = 0;
    }
    break;
  case 0xcc:
    setworn((obj *)0x0,0x10000);
    if (u.uprops[0x1f].extrinsic != 0) {
      return;
    }
    if ((u.uprops[0x1f].intrinsic & 0x7000000) != 0) {
      return;
    }
    u.uprops[0x1f].intrinsic = 0;
    return;
  case 0xd1:
    if ((u._1052_1_ & 2) != 0) {
      setworn((obj *)0x0,0x10000);
      uVar1 = (youmonst.data)->mflags1;
      if ((uVar1 >> 10 & 1) != 0) {
        return;
      }
      if ((uVar1 & 2) != 0) {
        return;
      }
      if ((uVar1 & 0x200) != 0) {
        return;
      }
      if (u.uprops[0x39].intrinsic != 0) {
        return;
      }
      if (u.uprops[0x39].extrinsic != 0) {
        return;
      }
      if ((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 2) != 0)) {
        return;
      }
      pline("You suddenly inhale an unhealthy amount of water!");
      drown();
      return;
    }
  }
  setworn((obj *)0x0,0x10000);
  return;
}

Assistant:

void Amulet_off(void)
{
    if (!uamul) return;

    Oprops_off(uamul, W_AMUL);

    takeoff_mask &= ~W_AMUL;

    switch(uamul->otyp) {
	case AMULET_OF_ESP:
		/* need to update ability before calling see_monsters() */
		setworn(NULL, W_AMUL);
		see_monsters();
		return;
	case AMULET_OF_LIFE_SAVING:
	case AMULET_VERSUS_POISON:
	case AMULET_OF_REFLECTION:
	case AMULET_OF_CHANGE:
	case AMULET_OF_UNCHANGING:
	case FAKE_AMULET_OF_YENDOR:
		break;
	case AMULET_OF_MAGICAL_BREATHING:
		if (Underwater) {
		    /* HMagical_breathing must be set off
			before calling drown() */
		    setworn(NULL, W_AMUL);
		    if (!breathless(youmonst.data) && !amphibious(youmonst.data)
						&& !Swimming) {
			pline("You suddenly inhale an unhealthy amount of water!");
		    	drown();
		    }
		    return;
		}
		break;
	case AMULET_OF_STRANGULATION:
		if (Strangled) {
			pline("You can breathe more easily!");
			Strangled = 0;
		}
		break;
	case AMULET_OF_RESTFUL_SLEEP:
		setworn(NULL, W_AMUL);
		if (!ESleeping && !(HSleeping & INTRINSIC))
			HSleeping = 0;
		return;
	case AMULET_OF_YENDOR:
		break;
    }
    setworn(NULL, W_AMUL);
    return;
}